

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBuffer.cpp
# Opt level: O0

void __thiscall yb::LineBuffer::move(LineBuffer *this,int n)

{
  iterator __first;
  difference_type dVar1;
  iterator begin;
  int n_local;
  LineBuffer *this_local;
  
  __first = std::begin<std::__cxx11::string>(&this->buffer_);
  if ((n < 0) &&
     (dVar1 = std::distance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )__first._M_current,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(this->position_)._M_current), dVar1 < -n)) {
    (this->position_)._M_current = __first._M_current;
    return;
  }
  __gnu_cxx::
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator+=(&this->position_,(long)n);
  return;
}

Assistant:

void LineBuffer::move(int n) {
    auto begin = std::begin(buffer_);
    if (n < 0 && std::distance(begin, position_) < -n) {
        position_ = begin;
    }
    else {
        position_ += n;
    }
}